

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stats.cpp
# Opt level: O1

Vector3d * __thiscall
OpenMD::Stats::getVectorAverage(Vector3d *__return_storage_ptr__,Stats *this,int index)

{
  long lVar1;
  uint i;
  long lVar2;
  
  (__return_storage_ptr__->super_Vector<double,_3U>).data_[0] = 0.0;
  (__return_storage_ptr__->super_Vector<double,_3U>).data_[1] = 0.0;
  (__return_storage_ptr__->super_Vector<double,_3U>).data_[2] = 0.0;
  lVar1 = __dynamic_cast((this->data_).
                         super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
                         ._M_impl.super__Vector_impl_data._M_start[index].accumulator,
                         &BaseAccumulator::typeinfo,&VectorAccumulator::typeinfo);
  if ((Vector3d *)(lVar1 + 0x28) != __return_storage_ptr__) {
    lVar2 = 0;
    do {
      (__return_storage_ptr__->super_Vector<double,_3U>).data_[lVar2] =
           (((Vector3d *)(lVar1 + 0x28))->super_Vector<double,_3U>).data_[lVar2];
      lVar2 = lVar2 + 1;
    } while (lVar2 != 3);
  }
  return __return_storage_ptr__;
}

Assistant:

Vector3d Stats::getVectorAverage(int index) {
    assert(index >= 0 && index < ENDINDEX);
    Vector3d value;
    dynamic_cast<VectorAccumulator*>(data_[index].accumulator)
        ->getAverage(value);
    return value;
  }